

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaBuildAContentModel(xmlSchemaParserCtxtPtr pctxt,xmlSchemaParticlePtr particle)

{
  xmlSchemaTreeItemPtr_conflict pxVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *str1;
  xmlAutomataStatePtr pxVar5;
  xmlAutomataStatePtr pxVar6;
  xmlAutomataStatePtr pxVar7;
  xmlAutomataStatePtr pxVar8;
  xmlSchemaTreeItemPtr pxVar9;
  xmlAutomataPtr pxVar10;
  xmlChar *in_R8;
  xmlChar *token2;
  xmlSchemaParticlePtr pxVar11;
  bool bVar12;
  
  if (particle == (xmlSchemaParticlePtr)0x0) {
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaBuildAContentModel","particle is NULL",
               (xmlChar *)0x0,in_R8);
    return 1;
  }
  pxVar1 = particle->children;
  if (pxVar1 == (xmlSchemaTreeItemPtr_conflict)0x0) {
    return 1;
  }
  switch(pxVar1->type) {
  case XML_SCHEMA_TYPE_BASIC:
    str1 = "simple type definition";
    if (pxVar1[5].type == 0x2d) {
      str1 = "complex type definition";
    }
    goto LAB_001c9114;
  case XML_SCHEMA_TYPE_ANY:
    pxVar8 = pctxt->state;
    pxVar5 = xmlAutomataNewState(pctxt->am);
    iVar4 = particle->maxOccurs;
    if (iVar4 == 0x40000000) {
      iVar4 = 0x40000000;
    }
    else {
      if (iVar4 == 1) {
        if (*(int *)((long)&pxVar1[1].annot + 4) == 1) {
          pxVar7 = xmlAutomataNewTransition2
                             (pctxt->am,pxVar8,(xmlAutomataStatePtr)0x0,"*","*",pxVar1);
          pctxt->state = pxVar7;
          xmlAutomataNewEpsilon(pctxt->am,pxVar7,pxVar5);
          pxVar7 = xmlAutomataNewTransition2
                             (pctxt->am,pxVar8,(xmlAutomataStatePtr)0x0,"*",(xmlChar *)0x0,pxVar1);
          pctxt->state = pxVar7;
          xmlAutomataNewEpsilon(pctxt->am,pxVar7,pxVar5);
        }
        else {
          pxVar9 = pxVar1[1].next;
          if (pxVar9 == (xmlSchemaTreeItemPtr)0x0) {
            if (pxVar1[1].children != (xmlSchemaTreeItemPtr)0x0) {
              pxVar7 = xmlAutomataNewNegTrans
                                 (pctxt->am,pxVar8,pxVar5,"*",(xmlChar *)(pxVar1[1].children)->annot
                                  ,pxVar1);
              pctxt->state = pxVar7;
            }
          }
          else {
            do {
              pctxt->state = pxVar8;
              pxVar7 = xmlAutomataNewTransition2
                                 (pctxt->am,pxVar8,(xmlAutomataStatePtr)0x0,"*",
                                  (xmlChar *)pxVar9->annot,pxVar1);
              pctxt->state = pxVar7;
              xmlAutomataNewEpsilon(pctxt->am,pxVar7,pxVar5);
              pxVar9 = *(xmlSchemaTreeItemPtr *)pxVar9;
            } while (pxVar9 != (xmlSchemaTreeItemPtr)0x0);
          }
        }
        goto LAB_001c9978;
      }
      iVar4 = iVar4 + -1;
    }
    iVar2 = 0;
    if (0 < particle->minOccurs) {
      iVar2 = particle->minOccurs + -1;
    }
    iVar4 = xmlAutomataNewCounter(pctxt->am,iVar2,iVar4);
    pxVar7 = xmlAutomataNewState(pctxt->am);
    if (*(int *)((long)&pxVar1[1].annot + 4) == 1) {
      pxVar6 = xmlAutomataNewTransition2(pctxt->am,pxVar8,(xmlAutomataStatePtr)0x0,"*","*",pxVar1);
      pctxt->state = pxVar6;
      xmlAutomataNewEpsilon(pctxt->am,pxVar6,pxVar7);
      pxVar6 = xmlAutomataNewTransition2
                         (pctxt->am,pxVar8,(xmlAutomataStatePtr)0x0,"*",(xmlChar *)0x0,pxVar1);
      pctxt->state = pxVar6;
      xmlAutomataNewEpsilon(pctxt->am,pxVar6,pxVar7);
    }
    else {
      pxVar9 = pxVar1[1].next;
      if (pxVar9 == (xmlSchemaTreeItemPtr)0x0) {
        if (pxVar1[1].children != (xmlSchemaTreeItemPtr)0x0) {
          pxVar6 = xmlAutomataNewNegTrans
                             (pctxt->am,pxVar8,pxVar7,"*",(xmlChar *)(pxVar1[1].children)->annot,
                              pxVar1);
          pctxt->state = pxVar6;
        }
      }
      else {
        do {
          pxVar6 = xmlAutomataNewTransition2
                             (pctxt->am,pxVar8,(xmlAutomataStatePtr)0x0,"*",(xmlChar *)pxVar9->annot
                              ,pxVar1);
          pctxt->state = pxVar6;
          xmlAutomataNewEpsilon(pctxt->am,pxVar6,pxVar7);
          pxVar9 = *(xmlSchemaTreeItemPtr *)pxVar9;
        } while (pxVar9 != (xmlSchemaTreeItemPtr)0x0);
      }
    }
    xmlAutomataNewCountedTrans(pctxt->am,pxVar7,pxVar8,iVar4);
    xmlAutomataNewCounterTrans(pctxt->am,pxVar7,pxVar5,iVar4);
LAB_001c9978:
    bVar12 = particle->minOccurs == 0;
    if (bVar12) {
      xmlAutomataNewEpsilon(pctxt->am,pxVar8,pxVar5);
    }
    pctxt->state = pxVar5;
    return (uint)bVar12;
  default:
    str1 = (char *)xmlSchemaItemTypeToStr(pxVar1->type);
LAB_001c9114:
    xmlSchemaInternalErr2
              ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaBuildAContentModel",
               "found unexpected term of type \'%s\' in content model",(xmlChar *)str1,in_R8);
    return 0;
  case XML_SCHEMA_TYPE_SEQUENCE:
    iVar4 = particle->minOccurs;
    if ((iVar4 == 1) && (particle->maxOccurs == 1)) {
      pxVar11 = (xmlSchemaParticlePtr)pxVar1->children;
      if (pxVar11 == (xmlSchemaParticlePtr)0x0) {
        return 1;
      }
      iVar4 = 1;
      do {
        iVar2 = xmlSchemaBuildAContentModel(pctxt,pxVar11);
        if (iVar2 == 0) {
          iVar4 = 0;
        }
        pxVar11 = (xmlSchemaParticlePtr)pxVar11->next;
      } while (pxVar11 != (xmlSchemaParticlePtr)0x0);
      return iVar4;
    }
    pxVar8 = pctxt->state;
    if (0x3fffffff < particle->maxOccurs) {
      pxVar8 = xmlAutomataNewEpsilon(pctxt->am,pxVar8,(xmlAutomataStatePtr)0x0);
      pctxt->state = pxVar8;
      if (1 < iVar4) {
        iVar2 = xmlAutomataNewCounter(pctxt->am,particle->minOccurs + -1,0x40000000);
        iVar4 = 1;
        for (pxVar11 = (xmlSchemaParticlePtr)particle->children->children;
            pxVar11 != (xmlSchemaParticlePtr)0x0; pxVar11 = (xmlSchemaParticlePtr)pxVar11->next) {
          iVar3 = xmlSchemaBuildAContentModel(pctxt,pxVar11);
          if (iVar3 == 0) {
            iVar4 = 0;
          }
        }
        pxVar5 = pctxt->state;
        xmlAutomataNewCountedTrans(pctxt->am,pxVar5,pxVar8,iVar2);
        pxVar5 = xmlAutomataNewCounterTrans(pctxt->am,pxVar5,(xmlAutomataStatePtr)0x0,iVar2);
        pctxt->state = pxVar5;
        if (iVar4 != 1) {
          return iVar4;
        }
        xmlAutomataNewEpsilon(pctxt->am,pxVar8,pxVar5);
        return 1;
      }
      iVar4 = 1;
      for (pxVar11 = (xmlSchemaParticlePtr)particle->children->children;
          pxVar11 != (xmlSchemaParticlePtr)0x0; pxVar11 = (xmlSchemaParticlePtr)pxVar11->next) {
        iVar2 = xmlSchemaBuildAContentModel(pctxt,pxVar11);
        if (iVar2 == 0) {
          iVar4 = 0;
        }
      }
      xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar8);
      pxVar5 = xmlAutomataNewEpsilon(pctxt->am,pctxt->state,(xmlAutomataStatePtr)0x0);
      goto LAB_001c981e;
    }
    if (iVar4 < 2 && particle->maxOccurs < 2) {
      iVar4 = 1;
      for (pxVar11 = (xmlSchemaParticlePtr)pxVar1->children; pxVar11 != (xmlSchemaParticlePtr)0x0;
          pxVar11 = (xmlSchemaParticlePtr)pxVar11->next) {
        iVar2 = xmlSchemaBuildAContentModel(pctxt,pxVar11);
        if (iVar2 == 0) {
          iVar4 = 0;
        }
      }
      pxVar5 = xmlAutomataNewEpsilon(pctxt->am,pctxt->state,(xmlAutomataStatePtr)0x0);
      pctxt->state = pxVar5;
      if (particle->minOccurs != 0) {
        return iVar4;
      }
      pxVar10 = pctxt->am;
      goto LAB_001c9a9e;
    }
    pxVar8 = xmlAutomataNewEpsilon(pctxt->am,pxVar8,(xmlAutomataStatePtr)0x0);
    pctxt->state = pxVar8;
    iVar4 = xmlAutomataNewCounter(pctxt->am,particle->minOccurs + -1,particle->maxOccurs + -1);
    pxVar11 = (xmlSchemaParticlePtr)particle->children->children;
    if (pxVar11 == (xmlSchemaParticlePtr)0x0) {
      bVar12 = true;
    }
    else {
      bVar12 = true;
      do {
        iVar2 = xmlSchemaBuildAContentModel(pctxt,pxVar11);
        if (iVar2 == 0) {
          bVar12 = false;
        }
        pxVar11 = (xmlSchemaParticlePtr)pxVar11->next;
      } while (pxVar11 != (xmlSchemaParticlePtr)0x0);
    }
    pxVar5 = pctxt->state;
    xmlAutomataNewCountedTrans(pctxt->am,pxVar5,pxVar8,iVar4);
    pxVar5 = xmlAutomataNewCounterTrans(pctxt->am,pxVar5,(xmlAutomataStatePtr)0x0,iVar4);
    pctxt->state = pxVar5;
    if ((particle->minOccurs != 0) && (!bVar12)) {
      return 0;
    }
    break;
  case XML_SCHEMA_TYPE_CHOICE:
    pxVar8 = pctxt->state;
    pxVar5 = xmlAutomataNewState(pctxt->am);
    iVar4 = particle->maxOccurs;
    if (iVar4 == 0x40000000) {
      iVar4 = 0x40000000;
    }
    else {
      if (iVar4 == 1) {
        iVar2 = 0;
        for (pxVar11 = (xmlSchemaParticlePtr)particle->children->children;
            pxVar11 != (xmlSchemaParticlePtr)0x0; pxVar11 = (xmlSchemaParticlePtr)pxVar11->next) {
          pctxt->state = pxVar8;
          iVar4 = xmlSchemaBuildAContentModel(pctxt,pxVar11);
          if (iVar4 != 0) {
            iVar2 = 1;
          }
          xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar5);
        }
        goto LAB_001c970c;
      }
      iVar4 = iVar4 + -1;
    }
    iVar3 = particle->minOccurs + -1;
    iVar2 = 0;
    if (particle->minOccurs < 1) {
      iVar3 = 0;
    }
    iVar4 = xmlAutomataNewCounter(pctxt->am,iVar3,iVar4);
    pxVar7 = xmlAutomataNewState(pctxt->am);
    pxVar6 = xmlAutomataNewState(pctxt->am);
    pxVar11 = (xmlSchemaParticlePtr)particle->children->children;
    if (pxVar11 != (xmlSchemaParticlePtr)0x0) {
      iVar2 = 0;
      do {
        pctxt->state = pxVar6;
        iVar3 = xmlSchemaBuildAContentModel(pctxt,pxVar11);
        if (iVar3 != 0) {
          iVar2 = 1;
        }
        xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar7);
        pxVar11 = (xmlSchemaParticlePtr)pxVar11->next;
      } while (pxVar11 != (xmlSchemaParticlePtr)0x0);
    }
    xmlAutomataNewEpsilon(pctxt->am,pxVar8,pxVar6);
    xmlAutomataNewCountedTrans(pctxt->am,pxVar7,pxVar6,iVar4);
    xmlAutomataNewCounterTrans(pctxt->am,pxVar7,pxVar5,iVar4);
    if (iVar2 == 1) {
      xmlAutomataNewEpsilon(pctxt->am,pxVar6,pxVar5);
    }
LAB_001c970c:
    if (particle->minOccurs == 0) {
      xmlAutomataNewEpsilon(pctxt->am,pxVar8,pxVar5);
      iVar2 = 1;
    }
    pctxt->state = pxVar5;
    return iVar2;
  case XML_SCHEMA_TYPE_ALL:
    pxVar11 = (xmlSchemaParticlePtr)pxVar1->children;
    if (pxVar11 == (xmlSchemaParticlePtr)0x0) {
      return 1;
    }
    pxVar8 = pctxt->state;
    pxVar5 = xmlAutomataNewState(pctxt->am);
    xmlAutomataNewEpsilon(pctxt->am,pctxt->state,pxVar5);
    pctxt->state = pxVar5;
    do {
      pctxt->state = pxVar5;
      pxVar1 = pxVar11->children;
      if (pxVar1 == (xmlSchemaTreeItemPtr_conflict)0x0) {
        xmlSchemaInternalErr2
                  ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaBuildAContentModel",
                   "<element> particle has no term",(xmlChar *)0x0,in_R8);
        return 0;
      }
      if (((ulong)pxVar1[2].children & 0x20000) == 0) {
        if (pxVar11->minOccurs == 0) {
          if (pxVar11->maxOccurs == 1) {
            in_R8 = *(xmlChar **)(pxVar1 + 3);
            xmlAutomataNewCountTrans2
                      (pctxt->am,pxVar5,pxVar5,(xmlChar *)pxVar1->next,in_R8,0,1,pxVar1);
          }
        }
        else if ((pxVar11->minOccurs == 1) && (pxVar11->maxOccurs == 1)) {
          in_R8 = *(xmlChar **)(pxVar1 + 3);
          xmlAutomataNewOnceTrans2(pctxt->am,pxVar5,pxVar5,(xmlChar *)pxVar1->next,in_R8,1,1,pxVar1)
          ;
        }
      }
      else {
        iVar4 = xmlAutomataNewCounter(pctxt->am,pxVar11->minOccurs,pxVar11->maxOccurs);
        xmlSchemaBuildContentModelForSubstGroup(pctxt,pxVar11,iVar4,pctxt->state);
      }
      pxVar11 = (xmlSchemaParticlePtr)pxVar11->next;
    } while (pxVar11 != (xmlSchemaParticlePtr)0x0);
    iVar4 = 0;
    pxVar5 = xmlAutomataNewAllTrans(pctxt->am,pctxt->state,(xmlAutomataStatePtr)0x0,0);
LAB_001c981e:
    pctxt->state = pxVar5;
    if (particle->minOccurs != 0) {
      return iVar4;
    }
    break;
  case XML_SCHEMA_TYPE_ELEMENT:
    if ((*(uint *)&pxVar1[2].children >> 0x11 & 1) != 0) {
      iVar4 = xmlSchemaBuildContentModelForSubstGroup(pctxt,particle,-1,(xmlAutomataStatePtr)0x0);
      return iVar4;
    }
    if ((*(uint *)&pxVar1[2].children & 0x10) != 0) {
      return 0;
    }
    iVar4 = particle->maxOccurs;
    if (iVar4 == 1) {
      pxVar10 = pctxt->am;
      pxVar8 = pctxt->state;
      pxVar9 = pxVar1->next;
      token2 = *(xmlChar **)(pxVar1 + 3);
      pxVar7 = (xmlAutomataStatePtr)0x0;
      pxVar5 = pxVar8;
LAB_001c9279:
      pxVar5 = xmlAutomataNewTransition2(pxVar10,pxVar5,pxVar7,(xmlChar *)pxVar9,token2,pxVar1);
    }
    else {
      if ((0x3fffffff < iVar4) && (particle->minOccurs < 2)) {
        pxVar8 = pctxt->state;
        pxVar7 = xmlAutomataNewTransition2
                           (pctxt->am,pxVar8,(xmlAutomataStatePtr)0x0,(xmlChar *)pxVar1->next,
                            *(xmlChar **)(pxVar1 + 3),pxVar1);
        pctxt->state = pxVar7;
        pxVar10 = pctxt->am;
        pxVar9 = pxVar1->next;
        token2 = *(xmlChar **)(pxVar1 + 3);
        pxVar5 = pxVar7;
        goto LAB_001c9279;
      }
      iVar2 = iVar4 + -1;
      if (iVar4 == 0x40000000) {
        iVar2 = 0x40000000;
      }
      iVar4 = particle->minOccurs + -1;
      if (particle->minOccurs < 1) {
        iVar4 = 0;
      }
      pxVar8 = xmlAutomataNewEpsilon(pctxt->am,pctxt->state,(xmlAutomataStatePtr)0x0);
      iVar4 = xmlAutomataNewCounter(pctxt->am,iVar4,iVar2);
      pxVar5 = xmlAutomataNewTransition2
                         (pctxt->am,pxVar8,(xmlAutomataStatePtr)0x0,(xmlChar *)pxVar1->next,
                          *(xmlChar **)(pxVar1 + 3),pxVar1);
      pctxt->state = pxVar5;
      xmlAutomataNewCountedTrans(pctxt->am,pxVar5,pxVar8,iVar4);
      pxVar5 = xmlAutomataNewCounterTrans(pctxt->am,pctxt->state,(xmlAutomataStatePtr)0x0,iVar4);
    }
    pctxt->state = pxVar5;
    if (particle->minOccurs != 0) {
      return 0;
    }
    pxVar10 = pctxt->am;
    pxVar5 = pctxt->state;
    goto LAB_001c9a9e;
  case XML_SCHEMA_TYPE_GROUP:
    goto switchD_001c90bd_caseD_11;
  }
  pxVar10 = pctxt->am;
LAB_001c9a9e:
  xmlAutomataNewEpsilon(pxVar10,pxVar8,pxVar5);
switchD_001c90bd_caseD_11:
  return 1;
}

Assistant:

static int
xmlSchemaBuildAContentModel(xmlSchemaParserCtxtPtr pctxt,
			    xmlSchemaParticlePtr particle)
{
    int ret = 0, tmp2;

    if (particle == NULL) {
	PERROR_INT("xmlSchemaBuildAContentModel", "particle is NULL");
	return(1);
    }
    if (particle->children == NULL) {
	/*
	* Just return in this case. A missing "term" of the particle
	* might arise due to an invalid "term" component.
	*/
	return(1);
    }

    switch (particle->children->type) {
	case XML_SCHEMA_TYPE_ANY: {
	    xmlAutomataStatePtr start, end;
	    xmlSchemaWildcardPtr wild;
	    xmlSchemaWildcardNsPtr ns;

	    wild = (xmlSchemaWildcardPtr) particle->children;

	    start = pctxt->state;
	    end = xmlAutomataNewState(pctxt->am);

	    if (particle->maxOccurs == 1) {
		if (wild->any == 1) {
		    /*
		    * We need to add both transitions:
		    *
		    * 1. the {"*", "*"} for elements in a namespace.
		    */
		    pctxt->state =
			xmlAutomataNewTransition2(pctxt->am,
			start, NULL, BAD_CAST "*", BAD_CAST "*", wild);
		    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, end);
		    /*
		    * 2. the {"*"} for elements in no namespace.
		    */
		    pctxt->state =
			xmlAutomataNewTransition2(pctxt->am,
			start, NULL, BAD_CAST "*", NULL, wild);
		    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, end);

		} else if (wild->nsSet != NULL) {
		    ns = wild->nsSet;
		    do {
			pctxt->state = start;
			pctxt->state = xmlAutomataNewTransition2(pctxt->am,
			    pctxt->state, NULL, BAD_CAST "*", ns->value, wild);
			xmlAutomataNewEpsilon(pctxt->am, pctxt->state, end);
			ns = ns->next;
		    } while (ns != NULL);

		} else if (wild->negNsSet != NULL) {
		    pctxt->state = xmlAutomataNewNegTrans(pctxt->am,
			start, end, BAD_CAST "*", wild->negNsSet->value,
			wild);
		}
	    } else {
		int counter;
		xmlAutomataStatePtr hop;
		int maxOccurs =
		    particle->maxOccurs == UNBOUNDED ? UNBOUNDED :
                                           particle->maxOccurs - 1;
		int minOccurs =
		    particle->minOccurs < 1 ? 0 : particle->minOccurs - 1;

		counter = xmlAutomataNewCounter(pctxt->am, minOccurs, maxOccurs);
		hop = xmlAutomataNewState(pctxt->am);
		if (wild->any == 1) {
		    pctxt->state =
			xmlAutomataNewTransition2(pctxt->am,
			start, NULL, BAD_CAST "*", BAD_CAST "*", wild);
		    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, hop);
		    pctxt->state =
			xmlAutomataNewTransition2(pctxt->am,
			start, NULL, BAD_CAST "*", NULL, wild);
		    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, hop);
		} else if (wild->nsSet != NULL) {
		    ns = wild->nsSet;
		    do {
			pctxt->state =
			    xmlAutomataNewTransition2(pctxt->am,
				start, NULL, BAD_CAST "*", ns->value, wild);
			xmlAutomataNewEpsilon(pctxt->am, pctxt->state, hop);
			ns = ns->next;
		    } while (ns != NULL);

		} else if (wild->negNsSet != NULL) {
		    pctxt->state = xmlAutomataNewNegTrans(pctxt->am,
			start, hop, BAD_CAST "*", wild->negNsSet->value,
			wild);
		}
		xmlAutomataNewCountedTrans(pctxt->am, hop, start, counter);
		xmlAutomataNewCounterTrans(pctxt->am, hop, end, counter);
	    }
	    if (particle->minOccurs == 0) {
		xmlAutomataNewEpsilon(pctxt->am, start, end);
                ret = 1;
	    }
	    pctxt->state = end;
            break;
	}
        case XML_SCHEMA_TYPE_ELEMENT:
	    ret = xmlSchemaBuildContentModelForElement(pctxt, particle);
	    break;
        case XML_SCHEMA_TYPE_SEQUENCE:{
            xmlSchemaTreeItemPtr sub;

            ret = 1;
            /*
             * If max and min occurrences are default (1) then
             * simply iterate over the particles of the <sequence>.
             */
            if ((particle->minOccurs == 1) && (particle->maxOccurs == 1)) {
                sub = particle->children->children;

                while (sub != NULL) {
                    tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                    if (tmp2 != 1) ret = 0;
                    sub = sub->next;
                }
            } else {
                xmlAutomataStatePtr oldstate = pctxt->state;

                if (particle->maxOccurs >= UNBOUNDED) {
                    if (particle->minOccurs > 1) {
                        xmlAutomataStatePtr tmp;
                        int counter;

                        pctxt->state = xmlAutomataNewEpsilon(pctxt->am,
                            oldstate, NULL);
                        oldstate = pctxt->state;

                        counter = xmlAutomataNewCounter(pctxt->am,
                            particle->minOccurs - 1, UNBOUNDED);

                        sub = particle->children->children;
                        while (sub != NULL) {
                            tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                            (xmlSchemaParticlePtr) sub);
                            if (tmp2 != 1) ret = 0;
                            sub = sub->next;
                        }
                        tmp = pctxt->state;
                        xmlAutomataNewCountedTrans(pctxt->am, tmp,
                                                   oldstate, counter);
                        pctxt->state =
                            xmlAutomataNewCounterTrans(pctxt->am, tmp,
                                                       NULL, counter);
                        if (ret == 1)
                            xmlAutomataNewEpsilon(pctxt->am,
                                                oldstate, pctxt->state);

                    } else {
                        pctxt->state = xmlAutomataNewEpsilon(pctxt->am,
                            oldstate, NULL);
                        oldstate = pctxt->state;

                        sub = particle->children->children;
                        while (sub != NULL) {
                            tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                            if (tmp2 != 1) ret = 0;
                            sub = sub->next;
                        }
                        xmlAutomataNewEpsilon(pctxt->am, pctxt->state,
                                              oldstate);
                        /*
                         * epsilon needed to block previous trans from
                         * being allowed to enter back from another
                         * construct
                         */
                        pctxt->state = xmlAutomataNewEpsilon(pctxt->am,
                                            pctxt->state, NULL);
                        if (particle->minOccurs == 0) {
                            xmlAutomataNewEpsilon(pctxt->am,
                                oldstate, pctxt->state);
                            ret = 1;
                        }
                    }
                } else if ((particle->maxOccurs > 1)
                           || (particle->minOccurs > 1)) {
                    xmlAutomataStatePtr tmp;
                    int counter;

                    pctxt->state = xmlAutomataNewEpsilon(pctxt->am,
                        oldstate, NULL);
                    oldstate = pctxt->state;

                    counter = xmlAutomataNewCounter(pctxt->am,
                        particle->minOccurs - 1,
                        particle->maxOccurs - 1);

                    sub = particle->children->children;
                    while (sub != NULL) {
                        tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                        if (tmp2 != 1) ret = 0;
                        sub = sub->next;
                    }
                    tmp = pctxt->state;
                    xmlAutomataNewCountedTrans(pctxt->am,
                        tmp, oldstate, counter);
                    pctxt->state =
                        xmlAutomataNewCounterTrans(pctxt->am, tmp, NULL,
                                                   counter);
                    if ((particle->minOccurs == 0) || (ret == 1)) {
                        xmlAutomataNewEpsilon(pctxt->am,
                                            oldstate, pctxt->state);
                        ret = 1;
                    }
                } else {
                    sub = particle->children->children;
                    while (sub != NULL) {
                        tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                        if (tmp2 != 1) ret = 0;
                        sub = sub->next;
                    }

		    /*
		     * epsilon needed to block previous trans from
		     * being allowed to enter back from another
		     * construct
		     */
		    pctxt->state = xmlAutomataNewEpsilon(pctxt->am,
					pctxt->state, NULL);

                    if (particle->minOccurs == 0) {
                        xmlAutomataNewEpsilon(pctxt->am, oldstate,
                                              pctxt->state);
                        ret = 1;
                    }
                }
            }
            break;
        }
        case XML_SCHEMA_TYPE_CHOICE:{
            xmlSchemaTreeItemPtr sub;
            xmlAutomataStatePtr start, end;

            ret = 0;
            start = pctxt->state;
            end = xmlAutomataNewState(pctxt->am);

            /*
             * iterate over the subtypes and remerge the end with an
             * epsilon transition
             */
            if (particle->maxOccurs == 1) {
                sub = particle->children->children;
                while (sub != NULL) {
                    pctxt->state = start;
                    tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                    if (tmp2 == 1) ret = 1;
                    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, end);
                    sub = sub->next;
                }
            } else {
                int counter;
                xmlAutomataStatePtr hop, base;
                int maxOccurs = particle->maxOccurs == UNBOUNDED ?
                    UNBOUNDED : particle->maxOccurs - 1;
                int minOccurs =
                    particle->minOccurs < 1 ? 0 : particle->minOccurs - 1;

                /*
                 * use a counter to keep track of the number of transitions
                 * which went through the choice.
                 */
                counter =
                    xmlAutomataNewCounter(pctxt->am, minOccurs, maxOccurs);
                hop = xmlAutomataNewState(pctxt->am);
                base = xmlAutomataNewState(pctxt->am);

                sub = particle->children->children;
                while (sub != NULL) {
                    pctxt->state = base;
                    tmp2 = xmlSchemaBuildAContentModel(pctxt,
                                        (xmlSchemaParticlePtr) sub);
                    if (tmp2 == 1) ret = 1;
                    xmlAutomataNewEpsilon(pctxt->am, pctxt->state, hop);
                    sub = sub->next;
                }
                xmlAutomataNewEpsilon(pctxt->am, start, base);
                xmlAutomataNewCountedTrans(pctxt->am, hop, base, counter);
                xmlAutomataNewCounterTrans(pctxt->am, hop, end, counter);
                if (ret == 1)
                    xmlAutomataNewEpsilon(pctxt->am, base, end);
            }
            if (particle->minOccurs == 0) {
                xmlAutomataNewEpsilon(pctxt->am, start, end);
                ret = 1;
            }
            pctxt->state = end;
            break;
        }
        case XML_SCHEMA_TYPE_ALL:{
            xmlAutomataStatePtr start, tmp;
            xmlSchemaParticlePtr sub;
            xmlSchemaElementPtr elemDecl;

            ret = 1;

            sub = (xmlSchemaParticlePtr) particle->children->children;
            if (sub == NULL)
                break;

            ret = 0;

            start = pctxt->state;
            tmp = xmlAutomataNewState(pctxt->am);
            xmlAutomataNewEpsilon(pctxt->am, pctxt->state, tmp);
            pctxt->state = tmp;
            while (sub != NULL) {
                pctxt->state = tmp;

                elemDecl = (xmlSchemaElementPtr) sub->children;
                if (elemDecl == NULL) {
                    PERROR_INT("xmlSchemaBuildAContentModel",
                        "<element> particle has no term");
                    return(ret);
                };
                /*
                * NOTE: The {max occurs} of all the particles in the
                * {particles} of the group must be 0 or 1; this is
                * already ensured during the parse of the content of
                * <all>.
                */
                if (elemDecl->flags & XML_SCHEMAS_ELEM_SUBST_GROUP_HEAD) {
                    int counter;

                    /*
                     * This is an abstract group, we need to share
                     * the same counter for all the element transitions
                     * derived from the group
                     */
                    counter = xmlAutomataNewCounter(pctxt->am,
                                       sub->minOccurs, sub->maxOccurs);
                    xmlSchemaBuildContentModelForSubstGroup(pctxt,
                                       sub, counter, pctxt->state);
                } else {
                    if ((sub->minOccurs == 1) &&
                        (sub->maxOccurs == 1)) {
                        xmlAutomataNewOnceTrans2(pctxt->am, pctxt->state,
                                                pctxt->state,
                                                elemDecl->name,
                                                elemDecl->targetNamespace,
                                                1, 1, elemDecl);
                    } else if ((sub->minOccurs == 0) &&
                        (sub->maxOccurs == 1)) {

                        xmlAutomataNewCountTrans2(pctxt->am, pctxt->state,
                                                 pctxt->state,
                                                 elemDecl->name,
                                                 elemDecl->targetNamespace,
                                                 0,
                                                 1,
                                                 elemDecl);
                    }
                }
                sub = (xmlSchemaParticlePtr) sub->next;
            }
            pctxt->state =
                xmlAutomataNewAllTrans(pctxt->am, pctxt->state, NULL, 0);
            if (particle->minOccurs == 0) {
                xmlAutomataNewEpsilon(pctxt->am, start, pctxt->state);
                ret = 1;
            }
            break;
        }
	case XML_SCHEMA_TYPE_GROUP:
	    /*
	    * If we hit a model group definition, then this means that
	    * it was empty, thus was not substituted for the containing
	    * model group. Just do nothing in this case.
	    * TODO: But the group should be substituted and not occur at
	    * all in the content model at this point. Fix this.
	    */
            ret = 1;
	    break;
        default:
	    xmlSchemaInternalErr2(ACTXT_CAST pctxt,
		"xmlSchemaBuildAContentModel",
		"found unexpected term of type '%s' in content model",
		WXS_ITEM_TYPE_NAME(particle->children), NULL);
            return(ret);
    }
    return(ret);
}